

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_write_header(mtar_t *tar,mtar_header_t *h)

{
  int iVar1;
  undefined1 local_218 [8];
  mtar_raw_header_t rh;
  mtar_header_t *h_local;
  mtar_t *tar_local;
  
  rh._padding._247_8_ = h;
  mtar_header_to_raw((mtar_raw_header_t *)local_218,h);
  tar->remaining_data = *(size_t *)(rh._padding._247_8_ + 8);
  iVar1 = mtar_twrite(tar,local_218,0x200);
  return iVar1;
}

Assistant:

int mtar_write_header(mtar_t *tar, const mtar_header_t *h) {
  mtar_raw_header_t rh;
  /* Build raw header and write */
  mtar_header_to_raw(&rh, h);
  tar->remaining_data = h->size;
  return mtar_twrite(tar, &rh, sizeof(rh));
}